

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O1

VisitError<typename_TagT<35U,_String>::Type::UnderlyingType> * __thiscall
Fixpp::visitTag<Fixpp::TagT<35u,Fixpp::Type::String>>
          (VisitError<typename_TagT<35U,_String>::Type::UnderlyingType> *__return_storage_ptr__,
          Fixpp *this,char *frame,size_t size)

{
  VisitError<View> local_58;
  
  visitTagView<Fixpp::TagT<35u,Fixpp::Type::String>>(&local_58,this,frame,size);
  result::details::ok::impl::Map<std::__cxx11::string(std::pair<char_const*,unsigned_long>const&)>::
  map<std::pair<char_const*,unsigned_long>,Fixpp::ErrorKind,Fixpp::visitTag<Fixpp::TagT<35u,Fixpp::Type::String>>(char_const*,unsigned_long)::_lambda(std::pair<char_const*,unsigned_long>const&)_1_>
            (__return_storage_ptr__,
             (Map<std::__cxx11::string(std::pair<char_const*,unsigned_long>const&)> *)&local_58);
  if (((local_58.ok_ != true) && (local_58.storage_.initialized_ != false)) &&
     ((undefined1 *)local_58.storage_.storage_._16_8_ !=
      (undefined1 *)((long)&local_58.storage_.storage_ + 0x20))) {
    operator_delete((void *)local_58.storage_.storage_._16_8_,local_58.storage_.storage_._32_8_ + 1)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

auto visitTag(const char* frame, size_t size) -> VisitError<typename Tag::Type::UnderlyingType>
    {
        return visitTagView<Tag>(frame, size).map([](const View& view)
        {
            return details::LexicalCast<typename Tag::Type>::cast(view.first, view.second);
        });
    }